

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aialgorithm.cpp
# Opt level: O1

void __thiscall Test_aialgorithm_fillZero_Test::TestBody(Test_aialgorithm_fillZero_Test *this)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper local_268;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  AssertHelper local_250;
  internal local_248 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240 [66];
  
  local_250.data_._0_1_ = 0;
  local_260.ptr_ = local_260.ptr_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<char,char>
            (local_248,"buf1[0]","\'\\0\'",(char *)&local_250,(char *)&local_260);
  if (local_248[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_260);
    if (local_240[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_240[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aialgorithm.cpp"
               ,0x4d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_268,(Message *)&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    if (local_260.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_260.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_260.ptr_ + 8))();
      }
      local_260.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_240,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_248[0] != (internal)0x0) {
    memset(local_248,0x41,0x210);
    lVar2 = 0;
    memset(local_248,0,0x210);
    do {
      local_268.data_ = local_268.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_260,"buf[i]","0",(int *)(local_248 + lVar2),(int *)&local_268);
      if (local_260.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_268);
        if (local_258.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_258.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_250,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aialgorithm.cpp"
                   ,0x58,pcVar3);
        testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_268);
        testing::internal::AssertHelper::~AssertHelper(&local_250);
        if (local_268.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_268.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_268.data_ + 8))();
          }
          local_268.data_ = (AssertHelperData *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_258,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        return;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_258,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x210);
  }
  return;
}

Assistant:

TEST_F(Test_aialgorithm, fillZero)
{
    // one
    {
        char buf1[1];
        std::memset(&buf1, 65, sizeof buf1);
        ai::fillZero(buf1);
        ASSERT_EQ(buf1[0], '\0');
    }

    // many
    {
        int        buf[132];
        const auto size2 = ai::countOf(buf);
        std::memset(&buf, 65, size2 * sizeof(int));
        ai::fillZero(buf);
        for (size_t i = 0; i < size2; i++)
        {
            ASSERT_EQ(buf[i], 0);
        }
    }
}